

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::PairMatcherImpl<std::pair<bool_const,bool>const&>::PairMatcherImpl<bool,bool>
          (PairMatcherImpl<std::pair<bool_const,bool>const&> *this,bool first_matcher,
          bool second_matcher)

{
  bool local_1a;
  bool local_19;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_01623eb8;
  local_1a = second_matcher;
  local_19 = first_matcher;
  Matcher<const_bool_&>::Matcher((Matcher<const_bool_&> *)(this + 8),&local_19);
  Matcher<const_bool_&>::Matcher((Matcher<const_bool_&> *)(this + 0x20),&local_1a);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}